

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

char * TextJoin(char **textList,int count,char *delimiter)

{
  int iVar1;
  char *text;
  uint uVar2;
  uint uVar3;
  char *__dest;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  __dest = TextJoin::text;
  uVar6 = 0;
  memset(TextJoin::text,0,0x400);
  uVar2 = TextLength(delimiter);
  uVar5 = (ulong)(uint)count;
  if (count < 1) {
    uVar5 = uVar6;
  }
  iVar4 = 0;
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    text = textList[uVar6];
    uVar3 = TextLength(text);
    iVar1 = uVar3 + iVar4;
    if (iVar1 < 0x400) {
      memcpy(__dest,text,(long)(int)uVar3);
      __dest = __dest + (int)uVar3;
      iVar4 = iVar1;
      if ((0 < (int)uVar2) && ((long)uVar6 < (long)(count + -1))) {
        memcpy(__dest,delimiter,(ulong)uVar2);
        iVar4 = iVar1 + uVar2;
        __dest = __dest + uVar2;
      }
    }
  }
  return TextJoin::text;
}

Assistant:

const char *TextJoin(const char **textList, int count, const char *delimiter)
{
    static char text[MAX_TEXT_BUFFER_LENGTH] = { 0 };
    memset(text, 0, MAX_TEXT_BUFFER_LENGTH);
    char *textPtr = text;

    int totalLength = 0;
    int delimiterLen = TextLength(delimiter);

    for (int i = 0; i < count; i++)
    {
        int textLength = TextLength(textList[i]);

        // Make sure joined text could fit inside MAX_TEXT_BUFFER_LENGTH
        if ((totalLength + textLength) < MAX_TEXT_BUFFER_LENGTH)
        {
            memcpy(textPtr, textList[i], textLength);
            totalLength += textLength;
            textPtr += textLength;

            if ((delimiterLen > 0) && (i < (count - 1)))
            {
                memcpy(textPtr, delimiter, delimiterLen);
                totalLength += delimiterLen;
                textPtr += delimiterLen;
            }
        }
    }

    return text;
}